

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_18::FunctionInfoScanner::visitFunction(FunctionInfoScanner *this,Function *curr)

{
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar1;
  mapped_type *pmVar2;
  bool bVar3;
  Index IVar4;
  Type *pTVar5;
  size_t sVar6;
  Signature SVar7;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar8;
  Type local_50;
  Iterator local_48;
  mapped_type *local_38;
  
  local_38 = std::
             unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
             ::operator[](this->infos,(key_type *)curr);
  SVar7 = HeapType::getSignature(&curr->type);
  local_50 = SVar7.params.id;
  local_48.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
  local_48.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = &local_50;
  PVar8 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)wasm::Type::end(&local_50);
  sVar6 = 0;
  pTVar5 = &local_50;
  do {
    PVar1.index = sVar6;
    PVar1.parent = pTVar5;
    if (PVar8 == PVar1) {
LAB_00a3de20:
      pmVar2 = local_38;
      IVar4 = Measurer::measure(curr->body);
      pmVar2->size = IVar4;
      if ((curr->body->_id == CallId) && (curr->body[1].type.id + 1 == (ulong)IVar4)) {
        pmVar2->isTrivialCall = true;
      }
      return;
    }
    pTVar5 = wasm::Type::Iterator::operator*(&local_48);
    bVar3 = TypeUpdating::canHandleAsLocal((Type)pTVar5->id);
    if (!bVar3) {
      local_38->inliningMode = Uninlineable;
      goto LAB_00a3de20;
    }
    sVar6 = local_48.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index + 1;
    pTVar5 = local_48.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    local_48.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = sVar6;
  } while( true );
}

Assistant:

void visitFunction(Function* curr) {
    auto& info = infos[curr->name];

    if (!canHandleParams(curr)) {
      info.inliningMode = InliningMode::Uninlineable;
    }

    info.size = Measurer::measure(curr->body);

    if (auto* call = curr->body->dynCast<Call>()) {
      if (info.size == call->operands.size() + 1) {
        // This function body is a call with some trivial (size 1) operands like
        // LocalGet or Const, so it is a trivial call.
        info.isTrivialCall = true;
      }
    }
  }